

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O0

string * __thiscall cppcms::http::request::http_accept_abi_cxx11_(request *this)

{
  long in_RSI;
  connection *in_RDI;
  
  cppcms::impl::cgi::connection::getenv_abi_cxx11_(in_RDI,*(char **)(in_RSI + 200));
  return (string *)in_RDI;
}

Assistant:

std::string request::http_accept() { return conn_->getenv("HTTP_ACCEPT"); }